

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxc.cxx
# Opt level: O1

bool __thiscall ExchCXX::detail::LibxcKernelImpl::is_hyb_(LibxcKernelImpl *this)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = ((this->kernel_).info)->family;
  bVar2 = true;
  if (((iVar1 != 0x20) && (iVar1 != 0x40)) && (iVar1 != 0x80)) {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool LibxcKernelImpl::is_hyb_() const noexcept {
  return
    (kernel_.info->family == XC_FAMILY_HYB_GGA ) or
    (kernel_.info->family == XC_FAMILY_HYB_MGGA)
#if XC_MAJOR_VERSION > 6
    or (kernel_.info->family == XC_FAMILY_HYB_LDA)
#endif
  ;
}